

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void __thiscall Js::JavascriptArray::DoTypeMutation(JavascriptArray *this)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = PAL_rand();
  if ((uVar2 & 1) == 0) {
    bVar1 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(this);
    if (bVar1) {
      uVar2 = PAL_rand();
      if ((uVar2 & 1) == 0) {
        JavascriptNativeIntArray::ToNativeFloatArray((JavascriptNativeIntArray *)this);
        return;
      }
      JavascriptNativeIntArray::ToVarArray((JavascriptNativeIntArray *)this);
      return;
    }
    bVar1 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(this);
    if (bVar1) {
      JavascriptNativeFloatArray::ToVarArray((JavascriptNativeFloatArray *)this);
      return;
    }
  }
  return;
}

Assistant:

void JavascriptArray::DoTypeMutation()
    {
        // Type transition

        uint32 random1 = static_cast<uint32>(rand());
        if (random1 % 2 == 0)
        {
            if (VarIs<JavascriptNativeIntArray>(this))
            {
                uint32 random2 = static_cast<uint32>(rand());
                if (random2 % 2 == 0)
                {
                    JavascriptNativeIntArray::ToNativeFloatArray(static_cast<JavascriptNativeIntArray*>(this));
                }
                else
                {
                    JavascriptNativeIntArray::ToVarArray(static_cast<JavascriptNativeIntArray*>(this));
                }
            }
            else if (VarIs<JavascriptNativeFloatArray>(this))
            {
                JavascriptNativeFloatArray::ToVarArray(static_cast<JavascriptNativeFloatArray*>(this));
            }
        }
    }